

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.h
# Opt level: O2

void __thiscall Js::ScopeInfo::SetPropertyName(ScopeInfo *this,int i,PropertyRecord *name)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->field_0x10 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ScopeInfo.h"
                                ,0x89,"(!areNamesCached)","!areNamesCached");
    if (!bVar2) goto LAB_007ddb9e;
    *puVar3 = 0;
  }
  if ((i < 0) || (this->symbolCount <= i)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ScopeInfo.h"
                                ,0x8a,"(i >= 0 && i < symbolCount)","i >= 0 && i < symbolCount");
    if (!bVar2) {
LAB_007ddb9e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
            ((WriteBarrierPtr<const_Js::PropertyRecord> *)(&this[1].parent + (long)i * 2),name);
  return;
}

Assistant:

void SetPropertyName(int i, PropertyRecord const* name)
        {
            Assert(!areNamesCached);
            Assert(i >= 0 && i < symbolCount);
            symbols[i].name = name;
        }